

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

string * __thiscall
Compiler::extractFileName_abi_cxx11_(string *__return_storage_ptr__,Compiler *this)

{
  bool bVar1;
  reference pcVar2;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  Compiler *this_local;
  string *fileName;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while ((bVar1 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&c), bVar1 &&
         (pcVar2 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end1), *pcVar2 != '.'))) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Compiler::extractFileName() {
    std::string fileName;

    for (const auto &c : filePath) {
        if (c == '.') break;
        fileName += c;
    }

    return fileName;
}